

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_crashes.cpp
# Opt level: O3

void __thiscall
CrashTest_PureVirtualMethodCallTest_Test::TestBody(CrashTest_PureVirtualMethodCallTest_Test *this)

{
  DeathTest *pDVar1;
  bool bVar2;
  int iVar3;
  char *message;
  char cVar4;
  DeathTest *pDVar5;
  DeathTest *gtest_dt;
  DeathTest *local_f8;
  DeathTest *local_f0;
  AssertHelper local_e8 [4];
  RE local_c8;
  Base local_38;
  
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::RE::Init(&local_c8,"");
    bVar2 = testing::internal::DeathTest::Create
                      ("Derived()",&local_c8,
                       "/workspace/llm4binary/github/license_c_cmakelists/ribtoks[P]chillout/src/tests/tests_crashes.cpp"
                       ,6,&local_f8);
    pDVar5 = local_f8;
    if (bVar2) {
      if (local_f8 == (DeathTest *)0x0) {
LAB_0010ac2c:
        testing::internal::RE::~RE(&local_c8);
        return;
      }
      local_f0 = local_f8;
      iVar3 = (*local_f8->_vptr_DeathTest[2])(local_f8);
      pDVar1 = local_f8;
      if (iVar3 == 0) {
        iVar3 = (*local_f8->_vptr_DeathTest[3])(local_f8);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
        iVar3 = (*local_f8->_vptr_DeathTest[4])(local_f8,(ulong)bVar2);
        cVar4 = (char)iVar3;
      }
      else {
        cVar4 = '\x01';
        if (iVar3 == 1) {
          bVar2 = testing::internal::AlwaysTrue();
          if (bVar2) {
            local_38.m_pDerived = (Derived *)&local_38;
            local_38._vptr_Base = (_func_int **)&PTR_function_00143be8;
            Base::~Base((Base *)local_38.m_pDerived);
          }
          (*local_f8->_vptr_DeathTest[5])(local_f8,2);
          (*pDVar1->_vptr_DeathTest[5])(pDVar1,0);
          pDVar5 = local_f0;
          if (local_f0 == (DeathTest *)0x0) goto LAB_0010ac2c;
        }
      }
      bVar2 = testing::internal::IsTrue(true);
      if (bVar2) {
        (*pDVar5->_vptr_DeathTest[1])(pDVar5);
      }
      if (cVar4 != '\0') goto LAB_0010ac2c;
    }
    testing::internal::RE::~RE(&local_c8);
  }
  testing::Message::Message((Message *)&local_c8);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (local_e8,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ribtoks[P]chillout/src/tests/tests_crashes.cpp"
             ,6,message);
  testing::internal::AssertHelper::operator=(local_e8,(Message *)&local_c8);
  testing::internal::AssertHelper::~AssertHelper(local_e8);
  if ((((long *)local_c8.pattern_ != (long *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     ((long *)local_c8.pattern_ != (long *)0x0)) {
    (**(code **)(*(long *)local_c8.pattern_ + 8))();
  }
  return;
}

Assistant:

TEST (CrashTest, PureVirtualMethodCallTest) {
    ASSERT_DEATH(Derived(), "");
}